

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O2

void __thiscall
ScriptBuilder_MaxScriptSizeOverErrorTest_Test::~ScriptBuilder_MaxScriptSizeOverErrorTest_Test
          (ScriptBuilder_MaxScriptSizeOverErrorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptBuilder, MaxScriptSizeOverErrorTest) {
  ScriptBuilder sb = ScriptBuilder();
  // dummy_data = sha256("0000")
  ByteData256 dummy_data = ByteData256(
      "96a296d224f285c67bee93c30f8a309157f0daa35dc5b87e410b78630a09cfc7");
  int64_t loop_num = (Script::kMaxScriptSize / 32) + 1;
  for (int64_t i = 0; i < loop_num; ++i) {
    sb.AppendData(dummy_data);
  }

  EXPECT_THROW(sb.Build(), CfdException);
}